

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixTruncate(sqlite3_file *id,i64 nByte)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int iErrno;
  sqlite3_io_methods *psVar4;
  long lVar5;
  
  uVar1 = *(uint *)&id[9].pMethods;
  if (0 < (int)uVar1) {
    lVar5 = nByte + (ulong)uVar1 + -1;
    nByte = lVar5 - lVar5 % (long)(ulong)uVar1;
  }
  uVar1 = *(uint *)&id[3].pMethods;
  do {
    iVar2 = (*aSyscall[6].pCurrent)((ulong)uVar1,nByte);
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        if ((long)id[10].pMethods <= nByte) {
          return 0;
        }
        id[10].pMethods = (sqlite3_io_methods *)nByte;
        return 0;
      }
      puVar3 = (uint *)__errno_location();
      break;
    }
    puVar3 = (uint *)__errno_location();
  } while (*puVar3 == 4);
  uVar1 = *puVar3;
  *(uint *)&id[4].pMethods = uVar1;
  psVar4 = id[7].pMethods;
  if (psVar4 == (sqlite3_io_methods *)0x0) {
    psVar4 = (sqlite3_io_methods *)0x1790dd;
  }
  sqlite3_log(0x60a,"os_unix.c:%d: (%d) %s(%s) - %s",0x6836,(ulong)uVar1,"ftruncate",psVar4,"");
  return 0x60a;
}

Assistant:

static int unixTruncate(sqlite3_file *id, i64 nByte){
  unixFile *pFile = (unixFile *)id;
  int rc;
  assert( pFile );
  SimulateIOError( return SQLITE_IOERR_TRUNCATE );

  /* If the user has configured a chunk-size for this file, truncate the
  ** file so that it consists of an integer number of chunks (i.e. the
  ** actual file size after the operation may be larger than the requested
  ** size).
  */
  if( pFile->szChunk>0 ){
    nByte = ((nByte + pFile->szChunk - 1)/pFile->szChunk) * pFile->szChunk;
  }

  rc = robust_ftruncate(pFile->h, (off_t)nByte);
  if( rc ){
    pFile->lastErrno = errno;
    return unixLogError(SQLITE_IOERR_TRUNCATE, "ftruncate", pFile->zPath);
  }else{
#ifdef SQLITE_DEBUG
    /* If we are doing a normal write to a database file (as opposed to
    ** doing a hot-journal rollback or a write to some file other than a
    ** normal database file) and we truncate the file to zero length,
    ** that effectively updates the change counter.  This might happen
    ** when restoring a database using the backup API from a zero-length
    ** source.
    */
    if( pFile->inNormalWrite && nByte==0 ){
      pFile->transCntrChng = 1;
    }
#endif

    /* If the file was just truncated to a size smaller than the currently
    ** mapped region, reduce the effective mapping size as well. SQLite will
    ** use read() and write() to access data beyond this point from now on.  
    */
    if( nByte<pFile->mmapSize ){
      pFile->mmapSize = nByte;
    }

    return SQLITE_OK;
  }
}